

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

void pushvalue(lua_State *L,lua_State *sL,uint8_t vt,value *v)

{
  char *s;
  undefined7 in_register_00000011;
  size_t sz;
  size_t local_18;
  
  switch((int)CONCAT71(in_register_00000011,vt)) {
  case 1:
    lua_pushnumber(L,v->n);
    return;
  case 2:
    local_18 = 0;
    s = lua_tolstring(sL,v->string,&local_18);
    lua_pushlstring(L,s,local_18);
    return;
  case 3:
    lua_pushboolean(L,v->string);
    return;
  case 4:
    lua_pushlightuserdata(L,v->tbl);
    return;
  case 5:
    lua_pushinteger(L,v->d);
    return;
  default:
    lua_pushnil(L);
    return;
  }
}

Assistant:

static void
pushvalue(lua_State *L, lua_State *sL, uint8_t vt, union value *v) {
	switch(vt) {
	case VALUETYPE_REAL:
		lua_pushnumber(L, v->n);
		break;
	case VALUETYPE_INTEGER:
		lua_pushinteger(L, v->d);
		break;
	case VALUETYPE_STRING: {
		size_t sz = 0;
		const char *str = lua_tolstring(sL, v->string, &sz);
		lua_pushlstring(L, str, sz);
		break;
	}
	case VALUETYPE_BOOLEAN:
		lua_pushboolean(L, v->boolean);
		break;
	case VALUETYPE_TABLE:
		lua_pushlightuserdata(L, v->tbl);
		break;
	default:
		lua_pushnil(L);
		break;
	}
}